

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int b;
  undefined8 *puVar1;
  stbi__uint32 a;
  stbi__uint32 b_00;
  stbi__context *s;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  int iVar12;
  long lVar13;
  int a_00;
  ulong uVar14;
  int iVar15;
  int *piVar16;
  uint uVar17;
  ulong uVar18;
  
  s = z->s;
  sVar2 = stbi__get8(s);
  sVar3 = stbi__get8(s);
  if (10 < CONCAT11(sVar2,sVar3)) {
    sVar4 = stbi__get8(s);
    if (sVar4 != '\b') {
      stbi__g_failure_reason = "only 8-bit";
      return 0;
    }
    sVar4 = stbi__get8(s);
    sVar5 = stbi__get8(s);
    s->img_y = (uint)CONCAT11(sVar4,sVar5);
    if (CONCAT11(sVar4,sVar5) == 0) {
      stbi__g_failure_reason = "no header height";
      return 0;
    }
    sVar4 = stbi__get8(s);
    sVar5 = stbi__get8(s);
    s->img_x = (uint)CONCAT11(sVar4,sVar5);
    if (CONCAT11(sVar4,sVar5) == 0) {
      stbi__g_failure_reason = "0 width";
      return 0;
    }
    bVar6 = stbi__get8(s);
    if ((4 < bVar6) || ((0x1aU >> (bVar6 & 0x1f) & 1) == 0)) {
      stbi__g_failure_reason = "bad component count";
      return 0;
    }
    s->img_n = (uint)bVar6;
    if (bVar6 != 0) {
      lVar13 = 0;
      do {
        *(undefined8 *)((long)&z->img_comp[0].data + lVar13) = 0;
        *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar13) = 0;
        lVar13 = lVar13 + 0x60;
      } while ((ulong)bVar6 * 0x60 != lVar13);
    }
    if (CONCAT11(sVar2,sVar3) == (ushort)((ushort)bVar6 + (ushort)bVar6 * 2 + 8)) {
      z->rgb = 0;
      uVar18 = (ulong)(uint)s->img_n;
      if (0 < s->img_n) {
        piVar16 = &z->img_comp[0].tq;
        lVar13 = 0;
        do {
          bVar6 = stbi__get8(s);
          ((anon_struct_96_18_0d0905d3 *)(piVar16 + -3))->id = (uint)bVar6;
          if ((s->img_n == 3) && (bVar6 == "RGB"[lVar13])) {
            z->rgb = z->rgb + 1;
          }
          bVar6 = stbi__get8(s);
          piVar16[-2] = (uint)(bVar6 >> 4);
          if ((byte)(bVar6 + 0xb0) < 0xc0) {
            stbi__g_failure_reason = "bad H";
            return 0;
          }
          piVar16[-1] = bVar6 & 0xf;
          if ((bVar6 & 0xf) - 5 < 0xfffffffc) {
            stbi__g_failure_reason = "bad V";
            return 0;
          }
          bVar6 = stbi__get8(s);
          *piVar16 = (uint)bVar6;
          if (3 < bVar6) {
            stbi__g_failure_reason = "bad TQ";
            return 0;
          }
          lVar13 = lVar13 + 1;
          uVar18 = (ulong)s->img_n;
          piVar16 = piVar16 + 0x18;
        } while (lVar13 < (long)uVar18);
      }
      if (scan != 0) {
        return 1;
      }
      a = s->img_x;
      b_00 = s->img_y;
      iVar10 = (int)uVar18;
      iVar7 = stbi__mad3sizes_valid(a,b_00,iVar10,0);
      if (iVar7 == 0) {
        stbi__g_failure_reason = "too large";
        return 0;
      }
      uVar17 = 1;
      uVar14 = 1;
      if (0 < iVar10) {
        uVar14 = 1;
        lVar13 = 0;
        uVar17 = 1;
        do {
          uVar8 = *(uint *)((long)&z->img_comp[0].h + lVar13);
          uVar9 = *(uint *)((long)&z->img_comp[0].v + lVar13);
          if ((int)uVar17 < (int)uVar8) {
            uVar17 = uVar8;
          }
          if ((int)uVar14 < (int)uVar9) {
            uVar14 = (ulong)uVar9;
          }
          lVar13 = lVar13 + 0x60;
        } while ((uVar18 & 0xffffffff) * 0x60 != lVar13);
      }
      z->img_h_max = uVar17;
      iVar7 = (int)uVar14;
      z->img_v_max = iVar7;
      z->img_mcu_w = uVar17 * 8;
      z->img_mcu_h = iVar7 * 8;
      uVar8 = ((a + uVar17 * 8) - 1) / (uVar17 * 8);
      z->img_mcu_x = uVar8;
      uVar9 = ((b_00 + iVar7 * 8) - 1) / (uint)(iVar7 * 8);
      z->img_mcu_y = uVar9;
      if (iVar10 < 1) {
        return 1;
      }
      iVar10 = 1;
      lVar13 = 0;
      while( true ) {
        iVar15 = *(int *)((long)&z->img_comp[0].h + lVar13);
        iVar12 = *(int *)((long)&z->img_comp[0].v + lVar13);
        *(uint *)((long)&z->img_comp[0].x + lVar13) = (iVar15 * a + (uVar17 - 1)) / uVar17;
        *(int *)((long)&z->img_comp[0].y + lVar13) = (int)((iVar12 * b_00 + iVar7 + -1) / uVar14);
        iVar15 = iVar15 * uVar8;
        a_00 = iVar15 * 8;
        *(int *)((long)&z->img_comp[0].w2 + lVar13) = a_00;
        iVar12 = iVar12 * uVar9;
        b = iVar12 * 8;
        *(int *)((long)&z->img_comp[0].h2 + lVar13) = b;
        pvVar11 = stbi__malloc_mad2(a_00,b,0xf);
        puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar13);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&z->img_comp[0].coeff + lVar13) = 0;
        *(void **)((long)&z->img_comp[0].raw_data + lVar13) = pvVar11;
        why = extraout_EDX;
        if (pvVar11 == (void *)0x0) break;
        *(ulong *)((long)&z->img_comp[0].data + lVar13) = (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
        if (z->progressive != 0) {
          *(int *)((long)&z->img_comp[0].coeff_w + lVar13) = iVar15;
          *(int *)((long)&z->img_comp[0].coeff_h + lVar13) = iVar12;
          pvVar11 = stbi__malloc_mad3(a_00,b,2,0xf);
          *(void **)((long)&z->img_comp[0].raw_coeff + lVar13) = pvVar11;
          why = extraout_EDX_00;
          if (pvVar11 == (void *)0x0) break;
          *(ulong *)((long)&z->img_comp[0].coeff + lVar13) =
               (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
        }
        iVar10 = iVar10 + 1;
        lVar13 = lVar13 + 0x60;
        if ((uVar18 & 0xffffffff) * 0x60 == lVar13) {
          return 1;
        }
      }
      stbi__g_failure_reason = "outofmem";
      stbi__free_jpeg_components(z,iVar10,why);
      return 0;
    }
  }
  stbi__g_failure_reason = "bad SOF len";
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}